

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ImageButtonEx
               (ImGuiID id,ImTextureID texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,
               ImVec2 *padding,ImVec4 *bg_col,ImVec4 *tint_col)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImDrawList *pIVar3;
  float fVar4;
  undefined8 uVar5;
  float fVar6;
  ImGuiContext *pIVar7;
  ImRect IVar8;
  bool bVar9;
  bool bVar10;
  ImU32 IVar11;
  int iVar12;
  int idx;
  ImGuiContext *g;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  bool hovered;
  bool held;
  ImU32 local_6c;
  ImRect bb;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar7 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    IVar1 = (pIVar2->DC).CursorPos;
    auVar13._8_8_ = 0;
    auVar13._0_4_ = IVar1.x;
    auVar13._4_4_ = IVar1.y;
    fVar4 = (*padding).x;
    fVar6 = (*padding).y;
    auVar16._0_4_ = IVar1.x + (*size).x + fVar4 + fVar4;
    auVar16._4_4_ = IVar1.y + (*size).y + fVar6 + fVar6;
    auVar16._8_8_ = 0;
    bb = (ImRect)vmovlhps_avx(auVar13,auVar16);
    ItemSize(&bb,-1.0);
    bVar10 = false;
    bVar9 = ItemAdd(&bb,id,(ImRect *)0x0,0);
    if (bVar9) {
      bVar10 = ButtonBehavior(&bb,id,&hovered,&held,0);
      iVar12 = ((held ^ 1U) & hovered) + 0x15;
      idx = 0x17;
      if ((hovered & 1U) == 0) {
        idx = iVar12;
      }
      if (held == false) {
        idx = iVar12;
      }
      local_6c = GetColorU32(idx,1.0);
      RenderNavHighlight(&bb,id,1);
      auVar13 = vminss_avx(ZEXT416((uint)padding->x),ZEXT416((uint)padding->y));
      auVar16 = vminss_avx(ZEXT416((uint)(pIVar7->Style).FrameRounding),auVar13);
      uVar5 = vcmpss_avx512f(auVar13,ZEXT816(0) << 0x40,1);
      RenderFrame(bb.Min,bb.Max,local_6c,true,
                  (float)((uint)!(bool)((byte)uVar5 & 1) * auVar16._0_4_));
      IVar8 = bb;
      if (0.0 < bg_col->w) {
        IVar1 = *padding;
        auVar14._8_8_ = 0;
        auVar14._0_4_ = IVar1.x;
        auVar14._4_4_ = IVar1.y;
        auVar19._8_8_ = 0;
        auVar19._0_4_ = bb.Max.x;
        auVar19._4_4_ = bb.Max.y;
        pIVar3 = pIVar2->DrawList;
        auVar17._0_4_ = IVar8.Min.x + IVar1.x;
        auVar17._4_4_ = IVar8.Min.y + IVar1.y;
        auVar17._8_8_ = 0;
        auVar13 = vsubps_avx(auVar19,auVar14);
        local_38 = (ImVec2)vmovlps_avx(auVar17);
        local_40 = (ImVec2)vmovlps_avx(auVar13);
        bb = IVar8;
        IVar11 = GetColorU32(bg_col);
        ImDrawList::AddRectFilled(pIVar3,&local_38,&local_40,IVar11,0.0,0);
      }
      IVar8 = bb;
      IVar1 = *padding;
      auVar15._8_8_ = 0;
      auVar15._0_4_ = IVar1.x;
      auVar15._4_4_ = IVar1.y;
      auVar20._8_8_ = 0;
      auVar20._0_4_ = bb.Max.x;
      auVar20._4_4_ = bb.Max.y;
      pIVar3 = pIVar2->DrawList;
      auVar18._0_4_ = IVar8.Min.x + IVar1.x;
      auVar18._4_4_ = IVar8.Min.y + IVar1.y;
      auVar18._8_8_ = 0;
      auVar13 = vsubps_avx(auVar20,auVar15);
      local_38 = (ImVec2)vmovlps_avx(auVar18);
      local_40 = (ImVec2)vmovlps_avx(auVar13);
      bb = IVar8;
      IVar11 = GetColorU32(tint_col);
      ImDrawList::AddImage(pIVar3,texture_id,&local_38,&local_40,uv0,uv1,IVar11);
    }
  }
  else {
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool ImGui::ImageButtonEx(ImGuiID id, ImTextureID texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, const ImVec2& padding, const ImVec4& bg_col, const ImVec4& tint_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size + padding * 2);
    ItemSize(bb);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, col, true, ImClamp((float)ImMin(padding.x, padding.y), 0.0f, g.Style.FrameRounding));
    if (bg_col.w > 0.0f)
        window->DrawList->AddRectFilled(bb.Min + padding, bb.Max - padding, GetColorU32(bg_col));
    window->DrawList->AddImage(texture_id, bb.Min + padding, bb.Max - padding, uv0, uv1, GetColorU32(tint_col));

    return pressed;
}